

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.cpp
# Opt level: O0

void __thiscall
Variable_variableEquivalencePublicAndPrivateInterface_Test::
Variable_variableEquivalencePublicAndPrivateInterface_Test
          (Variable_variableEquivalencePublicAndPrivateInterface_Test *this)

{
  Variable_variableEquivalencePublicAndPrivateInterface_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Variable_variableEquivalencePublicAndPrivateInterface_Test_0015b878;
  return;
}

Assistant:

TEST(Variable, variableEquivalencePublicAndPrivateInterface)
{
    libcellml::ModelPtr model = libcellml::Model::create();
    libcellml::ComponentPtr c1 = libcellml::Component::create();
    libcellml::ComponentPtr c2 = libcellml::Component::create();
    libcellml::ComponentPtr c3 = libcellml::Component::create();

    model->setName("model");
    c1->setName("c1");
    c2->setName("c2");
    c3->setName("c3");

    model->addComponent(c1);
    c1->addComponent(c2);
    c2->addComponent(c3);

    libcellml::VariablePtr v1 = libcellml::Variable::create();
    v1->setName("v1");
    v1->setUnits("dimensionless");

    libcellml::VariablePtr v2 = libcellml::Variable::create();
    v2->setName("v2");
    v2->setUnits("dimensionless");

    libcellml::VariablePtr v3 = libcellml::Variable::create();
    v3->setName("v3");
    v3->setUnits("dimensionless");

    c1->addVariable(v1);
    c2->addVariable(v2);
    c3->addVariable(v3);

    libcellml::Variable::addEquivalence(v1, v2);
    libcellml::Variable::addEquivalence(v3, v2);

    EXPECT_TRUE(model->fixVariableInterfaces());

    EXPECT_EQ("private", v1->interfaceType());
    EXPECT_EQ("public_and_private", v2->interfaceType());
    EXPECT_EQ("public", v3->interfaceType());
}